

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessMove.h
# Opt level: O1

string * __thiscall
senjo::ChessMove::ToString_abi_cxx11_(string *__return_storage_ptr__,ChessMove *this)

{
  uint uVar1;
  uint uVar2;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (this->from).sqr;
  if (((uVar1 & 0xffffff88) == 0) &&
     (uVar2 = (this->to).sqr, uVar1 != uVar2 && (uVar2 & 0xffffff88) == 0)) {
    Square::ToString_abi_cxx11_(&local_48,&this->from);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    Square::ToString_abi_cxx11_(&local_48,&this->to);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (this->promo != '\0') {
      tolower((int)this->promo);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
    std::string str;
    if (from.IsValid() && to.IsValid() && (from != to)) {
      str += from.ToString();
      str += to.ToString();
      if (promo) {
        str += tolower(promo);
      }
    }
    return str;
  }